

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
          (Parameter<std::pair<int,int>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  pair<int,_int> tmp;
  RepType local_48;
  string local_40;
  
  local_48.first = 0;
  local_48.second = 0;
  std::__cxx11::string::string((string *)&local_40,(string *)data);
  bVar1 = ParameterTraits<std::pair<int,_int>_>::convert(&local_40,&local_48);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    this[0x2a] = (Parameter<std::pair<int,int>>)0x0;
    *(RepType *)(this + 0x2c) = local_48;
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }